

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void * If_ManDeriveGiaFromCells(void *pGia)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Ifn_Ntk_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_02;
  Vec_Int_t *vCover_00;
  int *piVar6;
  word *pConfigData_00;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int local_68;
  int Count;
  int nConfigInts;
  int iVar;
  int iLut;
  int i;
  int k;
  word *pConfigData;
  Gia_Obj_t *pObj;
  Ifn_Ntk_t *pNtkCell;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p;
  void *pGia_local;
  
  local_68 = 0;
  if (*(long *)((long)pGia + 0x138) == 0) {
    __assert_fail("p->vConfigs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x344,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(long *)((long)pGia + 0x140) == 0) {
    __assert_fail("p->pCellStr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x345,"void *If_ManDeriveGiaFromCells(void *)");
  }
  iVar1 = Gia_ManHasMapping((Gia_Man_t *)pGia);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x346,"void *If_ManDeriveGiaFromCells(void *)");
  }
  p_00 = Ifn_NtkParse(*(char **)((long)pGia + 0x140));
  Ifn_Prepare(p_00,(word *)0x0,p_00->nInps);
  iVar1 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x138),1);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)pGia);
  p_01 = Gia_ManStart((iVar2 * 6) / 5 + 100);
  pcVar4 = Abc_UtilStrsav(*pGia);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(*(char **)((long)pGia + 8));
  p_01->pSpec = pcVar4;
  Gia_ManFillValue((Gia_Man_t *)pGia);
  pGVar5 = Gia_ManConst0((Gia_Man_t *)pGia);
  pGVar5->Value = 0;
  iVar = 0;
  while( true ) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)((long)pGia + 0x40));
    bVar8 = false;
    if (iVar < iVar2) {
      pConfigData = (word *)Gia_ManCi((Gia_Man_t *)pGia,iVar);
      bVar8 = (Gia_Obj_t *)pConfigData != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar2 = Gia_ManAppendCi(p_01);
    *(int *)(pConfigData + 1) = iVar2;
    iVar = iVar + 1;
  }
  p_02 = Vec_IntAlloc(0x10);
  vCover_00 = Vec_IntAlloc(0x10000);
  Gia_ManHashStart(p_01);
  nConfigInts = 0;
  while( true ) {
    bVar8 = false;
    if (nConfigInts < *(int *)((long)pGia + 0x18)) {
      pConfigData = (word *)Gia_ManObj((Gia_Man_t *)pGia,nConfigInts);
      bVar8 = (Gia_Obj_t *)pConfigData != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)pConfigData);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjIsBuf((Gia_Obj_t *)pConfigData);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsLut((Gia_Man_t *)pGia,nConfigInts);
        if (iVar2 != 0) {
          Vec_IntClear(p_02);
          for (iLut = 0; iVar2 = Gia_ObjLutSize((Gia_Man_t *)pGia,nConfigInts), iLut < iVar2;
              iLut = iLut + 1) {
            piVar6 = Gia_ObjLutFanins((Gia_Man_t *)pGia,nConfigInts);
            pGVar5 = Gia_ManObj((Gia_Man_t *)pGia,piVar6[iLut]);
            Vec_IntPush(p_02,pGVar5->Value);
          }
          pConfigData_00 =
               (word *)Vec_IntEntryP(*(Vec_Int_t **)((long)pGia + 0x138),iVar1 * local_68 + 2);
          uVar3 = If_ManSatDeriveGiaFromBits(p_01,p_00,pConfigData_00,p_02,vCover_00);
          pGVar5 = Gia_ManObj((Gia_Man_t *)pGia,nConfigInts);
          pGVar5->Value = uVar3;
          local_68 = local_68 + 1;
        }
      }
      else {
        iVar2 = Gia_ObjFanin0Copy((Gia_Obj_t *)pConfigData);
        iVar2 = Gia_ManAppendBuf(p_01,iVar2);
        *(int *)(pConfigData + 1) = iVar2;
      }
    }
    nConfigInts = nConfigInts + 1;
  }
  iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x138),0);
  if (iVar2 == local_68) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)((long)pGia + 0x138));
    if (iVar2 == iVar1 * local_68 + 2) {
      iVar = 0;
      while( true ) {
        iVar1 = Vec_IntSize(*(Vec_Int_t **)((long)pGia + 0x48));
        bVar8 = false;
        if (iVar < iVar1) {
          pConfigData = (word *)Gia_ManCo((Gia_Man_t *)pGia,iVar);
          bVar8 = (Gia_Obj_t *)pConfigData != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pConfigData);
        iVar1 = Gia_ManAppendCo(p_01,iVar1);
        *(int *)(pConfigData + 1) = iVar1;
        iVar = iVar + 1;
      }
      Gia_ManHashStop(p_01);
      iVar1 = Gia_ManRegNum((Gia_Man_t *)pGia);
      Gia_ManSetRegNum(p_01,iVar1);
      Vec_IntFree(p_02);
      Vec_IntFree(vCover_00);
      if (p_00 != (Ifn_Ntk_t *)0x0) {
        free(p_00);
      }
      pGVar7 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar7;
    }
    __assert_fail("Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x36f,"void *If_ManDeriveGiaFromCells(void *)");
  }
  __assert_fail("Vec_IntEntry(p->vConfigs, 0) == Count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x36e,"void *If_ManDeriveGiaFromCells(void *)");
}

Assistant:

void * If_ManDeriveGiaFromCells( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Ifn_Ntk_t * pNtkCell;
    Gia_Obj_t * pObj; 
    word * pConfigData;
    //word * pTruth;
    int k, i, iLut, iVar;
    int nConfigInts, Count = 0;
    assert( p->vConfigs != NULL );
    assert( p->pCellStr != NULL );
    assert( Gia_ManHasMapping(p) );
    // derive cell network
    pNtkCell = Ifn_NtkParse( p->pCellStr );
    Ifn_Prepare( pNtkCell, NULL, pNtkCell->nInps );
    nConfigInts = Vec_IntEntry( p->vConfigs, 1 );
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    //Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        //Vec_IntClear( vLeaves );
        //Gia_LutForEachFanin( p, iLut, iVar, k )
        //    Vec_IntPush( vLeaves, iVar );
        //pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        pConfigData = (word *)Vec_IntEntryP( p->vConfigs, 2 + nConfigInts * Count++ );
        Gia_ManObj(p, iLut)->Value = If_ManSatDeriveGiaFromBits( pNew, pNtkCell, pConfigData, vLeaves, vCover );
    }
    assert( Vec_IntEntry(p->vConfigs, 0) == Count );
    assert( Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count );
    //Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    ABC_FREE( pNtkCell );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;

}